

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void __thiscall ON_SHA1_Hash::Dump(ON_SHA1_Hash *this,ON_TextLog *text_log)

{
  bool bVar1;
  wchar_t *pwVar2;
  ON_wString sha1_hash;
  ON_wString local_18;
  
  ON_wString::ON_wString(&sha1_hash);
  bVar1 = ::operator==(&ZeroDigest,this);
  if (bVar1) {
    pwVar2 = L"ZeroDigest";
  }
  else {
    bVar1 = ::operator==(&EmptyContentHash,this);
    if (!bVar1) {
      ToString((ON_SHA1_Hash *)&local_18,SUB81(this,0));
      ON_wString::operator=(&sha1_hash,&local_18);
      ON_wString::~ON_wString(&local_18);
      goto LAB_005b7cfc;
    }
    pwVar2 = L"EmptyContentHash";
  }
  ON_wString::operator=(&sha1_hash,pwVar2);
LAB_005b7cfc:
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&sha1_hash);
  ON_TextLog::Print(text_log,L"ON_SHA1_Hash::%ls",pwVar2);
  ON_wString::~ON_wString(&sha1_hash);
  return;
}

Assistant:

void ON_SHA1_Hash::Dump(
class ON_TextLog& text_log
  ) const
{
  ON_wString sha1_hash;
  if ( ON_SHA1_Hash::ZeroDigest == *this )
    sha1_hash = L"ZeroDigest";
  else if ( ON_SHA1_Hash::EmptyContentHash == *this )
    sha1_hash = L"EmptyContentHash";
  else 
    sha1_hash = ToString(true);
  text_log.Print(L"ON_SHA1_Hash::%ls",static_cast<const wchar_t*>(sha1_hash));
}